

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O0

index_type *
booster::locale::boundary::details::
mapping_traits<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::random_access_iterator_tag>
::map(boundary_type t,
     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     b,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       e,locale *l)

{
  bool bVar1;
  reference pcVar2;
  difference_type dVar3;
  boundary_indexing<char> *pbVar4;
  undefined8 uVar5;
  vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  *__x;
  long lVar6;
  undefined8 in_RCX;
  char *in_RDX;
  undefined4 in_ESI;
  index_type *in_RDI;
  index_type tmp_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  index_type tmp;
  char_type *end;
  char_type *begin;
  index_type *result;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffee8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffef0;
  vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  allocator<char> *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __end;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff20;
  undefined1 local_b8 [31];
  allocator<char> local_99;
  undefined8 local_98;
  char *local_90;
  string local_88 [48];
  undefined1 local_58 [24];
  reference local_40;
  reference local_38;
  undefined1 local_29;
  undefined4 local_1c;
  undefined8 local_18;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10 [2];
  
  local_29 = 0;
  local_1c = in_ESI;
  local_18 = in_RCX;
  local_10[0]._M_current = in_RDX;
  std::
  vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
  ::vector((vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
            *)0x13eae8);
  bVar1 = __gnu_cxx::operator!=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  if (bVar1) {
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(local_10);
    local_38 = pcVar2;
    dVar3 = __gnu_cxx::operator-(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    local_40 = pcVar2 + dVar3;
    pbVar4 = std::use_facet<booster::locale::boundary::boundary_indexing<char>>
                       ((locale *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    (**(code **)(*(long *)pbVar4 + 0x10))(local_58,pbVar4,local_1c,local_38,local_40);
    std::
    vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
    ::swap((vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
            *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
           in_stack_fffffffffffffef8);
    std::
    vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
    ::~vector((vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
               *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  }
  else {
    local_90 = local_10[0]._M_current;
    local_98 = local_18;
    __end._M_current = (char *)&local_99;
    std::allocator<char>::allocator();
    std::__cxx11::string::
    string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff20,__end,in_stack_ffffffffffffff08);
    std::allocator<char>::~allocator(&local_99);
    pbVar4 = std::use_facet<booster::locale::boundary::boundary_indexing<char>>
                       ((locale *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    uVar5 = std::__cxx11::string::c_str();
    __x = (vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
           *)std::__cxx11::string::c_str();
    lVar6 = std::__cxx11::string::size();
    (**(code **)(*(long *)pbVar4 + 0x10))
              (local_b8,pbVar4,local_1c,uVar5,
               (long)&(__x->
                      super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                      )._M_impl.super__Vector_impl_data._M_start + lVar6);
    std::
    vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
    ::swap((vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
            *)CONCAT44(local_1c,in_stack_ffffffffffffff00),__x);
    std::
    vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
    ::~vector((vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
               *)CONCAT44(local_1c,in_stack_ffffffffffffff00));
    std::__cxx11::string::~string(local_88);
  }
  return in_RDI;
}

Assistant:

static index_type map(boundary_type t,IteratorType b,IteratorType e,std::locale const &l)
                    {
                        index_type result;

                        //
                        // Optimize for most common cases
                        //
                        // C++0x requires that string is continious in memory and all known
                        // string implementations
                        // do this because of c_str() support. 
                        //

                        if(linear_iterator_traits<char_type,IteratorType>::is_linear && b!=e)
                        {
                            char_type const *begin = &*b;
                            char_type const *end = begin + (e-b);
                            index_type tmp=std::use_facet<boundary_indexing<char_type> >(l).map(t,begin,end);
                            result.swap(tmp);
                        }
                        else {
                            std::basic_string<char_type> str(b,e);
                            index_type tmp = std::use_facet<boundary_indexing<char_type> >(l).map(t,str.c_str(),str.c_str()+str.size());
                            result.swap(tmp);
                        }
                        return result;
                    }